

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int select_negotiated_group
              (ptls_key_exchange_algorithm_t **selected,ptls_key_exchange_algorithm_t **candidates,
              uint8_t *src,uint8_t *end)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ushort *puVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ptls_key_exchange_algorithm_t *ppVar8;
  ptls_key_exchange_algorithm_t **pppVar9;
  
  iVar5 = 6;
  iVar2 = 0x32;
  puVar4 = (ushort *)src;
  if (1 < (ulong)((long)end - (long)src)) {
    lVar3 = 0;
    uVar6 = 0;
    do {
      uVar6 = (ulong)src[lVar3] | uVar6 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    puVar4 = (ushort *)(src + 2);
    uVar7 = (long)end - (long)puVar4;
    if (uVar6 <= uVar7) {
      if (uVar6 != 0) {
        do {
          lVar3 = (long)(src + uVar6 + 2) - (long)puVar4;
          iVar2 = 0x32;
          if (1 < lVar3) {
            uVar7 = (ulong)(ushort)(*puVar4 << 8 | *puVar4 >> 8);
            puVar4 = puVar4 + 1;
            iVar2 = 0;
          }
          iVar5 = 0;
          if (lVar3 < 2) {
            iVar5 = 6;
LAB_0011a5ca:
            bVar1 = false;
          }
          else {
            bVar1 = true;
            ppVar8 = *candidates;
            pppVar9 = candidates + 1;
            while (ppVar8 != (ptls_key_exchange_algorithm_t *)0x0) {
              if (ppVar8->id == (uint16_t)uVar7) {
                *selected = ppVar8;
                iVar5 = 1;
                goto LAB_0011a5ca;
              }
              ppVar8 = *pppVar9;
              pppVar9 = pppVar9 + 1;
            }
          }
          if (!bVar1) goto LAB_0011a5d8;
        } while (puVar4 != (ushort *)(src + uVar6 + 2));
      }
      iVar5 = 0;
    }
  }
LAB_0011a5d8:
  if (((iVar5 != 6) && (iVar2 = 0, iVar5 == 0)) && (iVar2 = 0x32, puVar4 == (ushort *)end)) {
    iVar2 = 0x28;
  }
  return iVar2;
}

Assistant:

static int select_negotiated_group(ptls_key_exchange_algorithm_t **selected, ptls_key_exchange_algorithm_t **candidates,
                                   const uint8_t *src, const uint8_t *const end)
{
    int ret;

    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t group;
            if ((ret = ptls_decode16(&group, &src, end)) != 0)
                goto Exit;
            ptls_key_exchange_algorithm_t **c = candidates;
            for (; *c != NULL; ++c) {
                if ((*c)->id == group) {
                    *selected = *c;
                    return 0;
                }
            }
        }
    });

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}